

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  Flow *pFVar1;
  ulong uVar2;
  long lVar3;
  Literal *pLVar4;
  undefined8 uVar5;
  long *plVar6;
  Type this_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  HeapType heapType;
  HeapType local_e8 [3];
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  GCData *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  StructNew *local_68;
  Literal *local_60;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_58;
  ExpressionRunner<wasm::ModuleRunner> *local_50;
  long *local_48;
  Flow *local_40;
  undefined1 local_31;
  
  local_68 = curr;
  local_50 = this;
  local_40 = __return_storage_ptr__;
  if (*(long *)(curr + 8) != 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(curr + 8);
    wasm::Type::getHeapType();
    plVar6 = (long *)wasm::HeapType::getStruct();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_b8,plVar6[1] - *plVar6 >> 4);
    lVar3 = *plVar6;
    local_48 = plVar6;
    if (plVar6[1] != lVar3) {
      local_58 = &(local_40->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
      local_60 = (local_40->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
      uVar2 = 1;
      uVar9 = 0;
      do {
        uVar8 = uVar2;
        pFVar1 = local_40;
        iVar7 = (int)uVar8;
        if (*(long *)(local_68 + 0x18) == 0) {
          wasm::Literal::makeZero((Type)local_e8);
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar9 * 0x18);
          if (iVar7 == 1) {
            pLVar4 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar4,(Literal *)local_e8);
          this_00.id = (uintptr_t)local_e8;
        }
        else {
          if (*(ulong *)(local_68 + 0x18) <= uVar9) goto LAB_0013165b;
          visit(local_40,local_50,*(Expression **)(*(long *)(local_68 + 0x10) + uVar9 * 8));
          if ((pFVar1->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_00131621;
          pLVar4 = Flow::getSingleValue(pFVar1);
          wasm::Literal::Literal((Literal *)&heapType,pLVar4);
          truncateForPacking((Literal *)local_e8,local_50,(Literal *)&heapType,
                             (Field *)(uVar9 * 0x10 + lVar3));
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar9 * 0x18);
          if (iVar7 == 1) {
            pLVar4 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar4,(Literal *)local_e8);
          wasm::Literal::~Literal((Literal *)local_e8);
          wasm::Literal::~Literal((Literal *)&heapType);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_58);
          this_00.id = (uintptr_t)local_60;
        }
        wasm::Literal::~Literal((Literal *)this_00.id);
        lVar3 = *local_48;
        uVar2 = (ulong)(iVar7 + 1);
        uVar9 = uVar8;
      } while (uVar8 < (ulong)(local_48[1] - lVar3 >> 4));
    }
    local_e8[0].id = wasm::Type::getHeapType();
    local_78 = (GCData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
              (&local_70,&local_78,(allocator<wasm::GCData> *)&local_31,local_e8,
               (Literals *)local_b8);
    uVar5 = wasm::Type::getHeapType();
    pFVar1 = local_40;
    wasm::Literal::Literal(&local_d0,&local_78,uVar5);
    Flow::Flow(pFVar1,&local_d0);
    wasm::Literal::~Literal(&local_d0);
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
    }
LAB_00131621:
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&data);
    return local_40;
  }
  local_48 = *(long **)(curr + 0x18);
  bVar10 = local_48 == (long *)0x0;
  if (!bVar10) {
    plVar6 = (long *)0x0;
    do {
      if (*(long **)(local_68 + 0x18) <= plVar6) {
LAB_0013165b:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,local_50,
            *(Expression **)(*(long *)(local_68 + 0x10) + (long)plVar6 * 8));
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        if (!bVar10) {
          return local_40;
        }
        break;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      plVar6 = (long *)((long)plVar6 + 1);
      bVar10 = local_48 == plVar6;
    } while (!bVar10);
  }
  wasm::handle_unreachable
            ("unreachable but no unreachable child",
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
             ,0x602);
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }